

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.h
# Opt level: O1

void __thiscall
cbtDbvt::collideTV(cbtDbvt *this,cbtDbvtNode *root,cbtDbvtVolume *vol,ICollide *policy)

{
  cbtDbvtNode *pcVar1;
  cbtDbvtNode **ppcVar2;
  long lVar3;
  int iVar4;
  char tempmemory [512];
  cbtAlignedObjectArray<const_cbtDbvtNode_*> local_260;
  float local_240;
  float local_23c;
  float local_238;
  float local_234;
  float local_230;
  float local_22c;
  cbtDbvtNode *local_228 [64];
  
  if (root != (cbtDbvtNode *)0x0) {
    local_230 = (vol->mi).m_floats[0];
    local_238 = (vol->mi).m_floats[1];
    local_240 = (vol->mi).m_floats[2];
    local_22c = (vol->mx).m_floats[0];
    local_234 = (vol->mx).m_floats[1];
    local_23c = (vol->mx).m_floats[2];
    local_260.m_ownsMemory = false;
    local_260.m_data = local_228;
    local_260.m_size = 1;
    local_260.m_capacity = 0x40;
    local_228[0] = root;
    do {
      pcVar1 = local_260.m_data[(long)local_260.m_size + -1];
      local_260.m_size = local_260.m_size + -1;
      if ((((((pcVar1->volume).mi.m_floats[0] <= local_22c) &&
            (local_230 <= (pcVar1->volume).mx.m_floats[0])) &&
           ((pcVar1->volume).mi.m_floats[1] <= local_234)) &&
          ((local_238 <= (pcVar1->volume).mx.m_floats[1] &&
           ((pcVar1->volume).mi.m_floats[2] <= local_23c)))) &&
         (local_240 <= (pcVar1->volume).mx.m_floats[2])) {
        if ((pcVar1->field_2).childs[1] == (cbtDbvtNode *)0x0) {
          (*policy->_vptr_ICollide[3])(policy,pcVar1);
        }
        else {
          if (local_260.m_size == local_260.m_capacity) {
            iVar4 = local_260.m_size * 2;
            if (local_260.m_size == 0) {
              iVar4 = 1;
            }
            if (local_260.m_capacity < iVar4) {
              if (iVar4 == 0) {
                ppcVar2 = (cbtDbvtNode **)0x0;
              }
              else {
                ppcVar2 = (cbtDbvtNode **)cbtAlignedAllocInternal((long)iVar4 << 3,0x10);
              }
              if (0 < (long)local_260.m_size) {
                lVar3 = 0;
                do {
                  ppcVar2[lVar3] = local_260.m_data[lVar3];
                  lVar3 = lVar3 + 1;
                } while (local_260.m_size != lVar3);
              }
              if ((local_260.m_data != (cbtDbvtNode **)0x0) && (local_260.m_ownsMemory == true)) {
                cbtAlignedFreeInternal(local_260.m_data);
              }
              local_260.m_ownsMemory = true;
              local_260.m_data = ppcVar2;
              local_260.m_capacity = iVar4;
            }
          }
          local_260.m_data[local_260.m_size] = (pcVar1->field_2).childs[0];
          local_260.m_size = local_260.m_size + 1;
          if (local_260.m_size == local_260.m_capacity) {
            iVar4 = local_260.m_size * 2;
            if (local_260.m_size == 0) {
              iVar4 = 1;
            }
            if (local_260.m_capacity < iVar4) {
              if (iVar4 == 0) {
                ppcVar2 = (cbtDbvtNode **)0x0;
              }
              else {
                ppcVar2 = (cbtDbvtNode **)cbtAlignedAllocInternal((long)iVar4 << 3,0x10);
              }
              if (0 < (long)local_260.m_size) {
                lVar3 = 0;
                do {
                  ppcVar2[lVar3] = local_260.m_data[lVar3];
                  lVar3 = lVar3 + 1;
                } while (local_260.m_size != lVar3);
              }
              if ((local_260.m_data != (cbtDbvtNode **)0x0) && (local_260.m_ownsMemory == true)) {
                cbtAlignedFreeInternal(local_260.m_data);
              }
              local_260.m_ownsMemory = true;
              local_260.m_data = ppcVar2;
              local_260.m_capacity = iVar4;
            }
          }
          local_260.m_data[local_260.m_size] = (pcVar1->field_2).childs[1];
          local_260.m_size = local_260.m_size + 1;
        }
      }
    } while (0 < local_260.m_size);
    cbtAlignedObjectArray<const_cbtDbvtNode_*>::~cbtAlignedObjectArray(&local_260);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void cbtDbvt::collideTV(const cbtDbvtNode* root,
							  const cbtDbvtVolume& vol,
							  DBVT_IPOLICY) const
{
	DBVT_CHECKTYPE
	if (root)
	{
		ATTRIBUTE_ALIGNED16(cbtDbvtVolume)
		volume(vol);
		cbtAlignedObjectArray<const cbtDbvtNode*> stack;
		stack.resize(0);
#ifndef BT_DISABLE_STACK_TEMP_MEMORY
		char tempmemory[SIMPLE_STACKSIZE * sizeof(const cbtDbvtNode*)];
		stack.initializeFromBuffer(tempmemory, 0, SIMPLE_STACKSIZE);
#else
		stack.reserve(SIMPLE_STACKSIZE);
#endif  //BT_DISABLE_STACK_TEMP_MEMORY

		stack.push_back(root);
		do
		{
			const cbtDbvtNode* n = stack[stack.size() - 1];
			stack.pop_back();
			if (Intersect(n->volume, volume))
			{
				if (n->isinternal())
				{
					stack.push_back(n->childs[0]);
					stack.push_back(n->childs[1]);
				}
				else
				{
					policy.Process(n);
				}
			}
		} while (stack.size() > 0);
	}
}